

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimatedLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  string *parmID;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  AnimatedLightNode *this_00;
  runtime_error *this_01;
  size_type *psVar6;
  size_t *in_RDX;
  long lVar7;
  size_type __n;
  ulong uVar8;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  lights;
  Vec2f time_range;
  undefined1 local_a0 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Ref<embree::XML> *local_58;
  BBox1f local_50;
  
  lVar7 = *(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80);
  if (lVar7 == 0) {
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    __n = lVar7 >> 3;
    local_68._8_8_ = this;
    local_58 = xml;
    std::
    vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
    ::vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              *)(local_a0 + 0x20),__n,(allocator_type *)local_a0);
    lVar7 = 0;
    local_68._M_allocated_capacity = __n;
    do {
      XML::child((XML *)&stack0xffffffffffffffb0,*in_RDX);
      loadLight((XMLLoader *)local_a0,local_58);
      uVar1 = local_a0._0_8_;
      if ((long *)local_a0._0_8_ == (long *)0x0) {
        plVar5 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(local_a0._0_8_,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::LightNode::typeinfo,0);
      }
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))(plVar5);
      }
      uVar2 = local_a0._32_8_;
      if (*(long **)(local_a0._32_8_ + lVar7 * 8) != (long *)0x0) {
        (**(code **)(**(long **)(local_a0._32_8_ + lVar7 * 8) + 0x18))();
      }
      *(long **)(uVar2 + lVar7 * 8) = plVar5;
      if ((long *)uVar1 != (long *)0x0) {
        (**(code **)(*(long *)uVar1 + 0x18))(uVar1);
      }
      if (local_50 != (BBox1f)0x0) {
        (**(code **)(*(long *)local_50 + 0x18))();
      }
      lVar7 = lVar7 + 1;
    } while (__n + (__n == 0) != lVar7);
    iVar3 = (**(code **)(**(long **)local_a0._32_8_ + 0x78))();
    this = (XMLLoader *)local_68._8_8_;
    uVar1 = local_68._M_allocated_capacity;
    if (1 < local_68._M_allocated_capacity) {
      uVar8 = 1;
      do {
        iVar4 = (**(code **)(**(long **)(local_a0._32_8_ + uVar8 * 8) + 0x78))();
        if (iVar3 != iVar4) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_
                    ((string *)&stack0xffffffffffffffb0,(ParseLocation *)(*in_RDX + 0x10));
          plVar5 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffffb0);
          local_a0._0_8_ = *plVar5;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_a0._0_8_ == psVar6) {
            local_a0._16_8_ = *psVar6;
            local_a0._24_8_ = plVar5[3];
            local_a0._0_8_ = local_a0 + 0x10;
          }
          else {
            local_a0._16_8_ = *psVar6;
          }
          local_a0._8_8_ = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::runtime_error::runtime_error(this_01,(string *)local_a0);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    parmID = (string *)*in_RDX;
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"time_range","");
    XML::parm_Vec2f((XML *)&stack0xffffffffffffffb0,parmID);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    this_00 = (AnimatedLightNode *)operator_new(0x88);
    SceneGraph::AnimatedLightNode::AnimatedLightNode
              (this_00,(vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                        *)(local_a0 + 0x20),local_50);
    *(AnimatedLightNode **)this = this_00;
    (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
    ::~vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               *)(local_a0 + 0x20));
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimatedLight(const Ref<XML>& xml) 
  {
    size_t numLights = xml->size();
    if (numLights == 0)
      return nullptr;

    /* load list of lights */
    std::vector<Ref<SceneGraph::LightNode>> lights(numLights);
    for (size_t i=0; i<numLights; i++) 
      lights[i] = loadLight(xml->child(i)).dynamicCast<SceneGraph::LightNode>();

    /* check that all lights are of same type */
    auto light_type = lights[0]->getType();
    for (size_t i=1; i<numLights; i++) {
      if (light_type != lights[i]->getType())
        THROW_RUNTIME_ERROR(xml->loc.str()+": light types do not match");
    }

    const Vec2f time_range = xml->parm_Vec2f("time_range");
    return new SceneGraph::AnimatedLightNode(std::move(lights),BBox1f(time_range.x,time_range.y));
  }